

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O1

void __thiscall
gss::innards::HomomorphismModel::_build_exact_path_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,uint number_of_exact_path_graphs,bool directed,bool at_most,
          bool pattern)

{
  int *piVar1;
  size_t *psVar2;
  _Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false> _Var3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  SVOBitset *pSVar7;
  undefined8 uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  _List_node_base *p_Var10;
  int iVar11;
  uint uVar12;
  pointer pSVar13;
  ulong uVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  int iVar16;
  pointer pSVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  BitWord BVar23;
  ulong uVar24;
  undefined4 in_register_00000084;
  ulong uVar25;
  uint uVar26;
  value_type nv;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  path_counts;
  value_type nc;
  allocator_type local_19a;
  allocator_type local_199;
  undefined8 local_198;
  HomomorphismModel *local_190;
  uint local_184;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *local_180;
  uint *local_178;
  ulong local_170;
  pointer local_168;
  BitWord local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [144];
  anon_union_128_2_84168a9f_for__data local_b8;
  uint local_38;
  
  local_198 = CONCAT44(in_register_00000084,number_of_exact_path_graphs);
  uVar25 = (ulong)size;
  local_b8.short_data[0] = local_b8.short_data[0] & 0xffffffff00000000;
  local_190 = this;
  local_184 = size;
  local_180 = graph_rows;
  local_178 = idx;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_158,uVar25,
             (value_type_conflict3 *)local_b8.short_data,&local_199);
  local_170 = uVar25;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)(local_148 + 0x78),uVar25,(value_type *)local_158,&local_19a);
  if ((SVOBitset *)local_158._0_8_ != (SVOBitset *)0x0) {
    operator_delete((void *)local_158._0_8_,local_148._0_8_ - local_158._0_8_);
  }
  if (local_184 != 0) {
    uVar25 = 0;
    do {
      iVar18 = (int)uVar25;
      SVOBitset::SVOBitset
                ((SVOBitset *)local_158,
                 (local_180->
                 super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                 )._M_impl.super__Vector_impl_data._M_start + local_190->max_graphs * iVar18);
      if (at_most) {
        pSVar7 = (SVOBitset *)local_158;
        if (0x10 < (uint)local_148._112_4_) {
          pSVar7 = (SVOBitset *)local_158._0_8_;
        }
        iVar11 = iVar18 + 0x3f;
        if (-1 < iVar18) {
          iVar11 = iVar18;
        }
        (pSVar7->_data).short_data[iVar11 >> 6] =
             (pSVar7->_data).short_data[iVar11 >> 6] | 1L << (uVar25 & 0x3f);
      }
      uVar20 = (ulong)(uint)local_148._112_4_;
      pSVar7 = (SVOBitset *)local_158;
      if (0x10 < uVar20) {
        pSVar7 = (SVOBitset *)local_158._0_8_;
      }
      uVar5 = 0xffffffff;
      if (uVar20 != 0) {
        lVar19 = 0;
        do {
          BVar23 = (pSVar7->_data).short_data[0];
          if (BVar23 != 0) goto LAB_0012a2c1;
          lVar19 = lVar19 + -0x40;
          pSVar7 = (SVOBitset *)((long)&pSVar7->_data + 8);
        } while (uVar20 * 0x40 + lVar19 != 0);
      }
LAB_0012a0ba:
      while (uVar5 != 0xffffffff) {
        pSVar7 = (SVOBitset *)local_158;
        if (0x10 < (uint)local_148._112_4_) {
          pSVar7 = (SVOBitset *)local_158._0_8_;
        }
        uVar6 = uVar5 + 0x3f;
        if (-1 < (int)uVar5) {
          uVar6 = uVar5;
        }
        bVar4 = (byte)uVar5 & 0x3f;
        (pSVar7->_data).short_data[(int)uVar6 >> 6] =
             (pSVar7->_data).short_data[(int)uVar6 >> 6] &
             (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
        SVOBitset::SVOBitset
                  ((SVOBitset *)&local_b8,
                   (local_180->
                   super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar5 * local_190->max_graphs);
        if (at_most) {
          uVar8 = &local_b8;
          if (0x10 < local_38) {
            uVar8 = local_b8.short_data[0];
          }
          *(ulong *)(uVar8 + (long)((int)uVar6 >> 6) * 8) =
               *(ulong *)(uVar8 + (long)((int)uVar6 >> 6) * 8) | 1L << ((ulong)uVar5 & 0x3f);
        }
        uVar20 = (ulong)local_38;
        uVar8 = &local_b8;
        if (0x10 < uVar20) {
          uVar8 = local_b8.long_data;
        }
        uVar5 = 0xffffffff;
        if (uVar20 != 0) {
          lVar19 = 0;
LAB_0012a178:
          uVar24 = *(ulong *)uVar8;
          if (uVar24 == 0) goto code_r0x0012a180;
          iVar18 = 0;
          for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            iVar18 = iVar18 + 1;
          }
          uVar5 = iVar18 - (int)lVar19;
        }
LAB_0012a199:
        if ((directed || uVar5 <= uVar25) && uVar5 != 0xffffffff) {
          lVar19 = *(long *)(local_148._120_8_ + uVar25 * 0x18);
          do {
            uVar8 = &local_b8;
            if (0x10 < local_38) {
              uVar8 = local_b8.long_data;
            }
            bVar4 = (byte)uVar5 & 0x3f;
            uVar6 = uVar5 + 0x3f;
            if (-1 < (int)uVar5) {
              uVar6 = uVar5;
            }
            *(ulong *)(uVar8 + (long)((int)uVar6 >> 6) * 8) =
                 *(ulong *)(uVar8 + (long)((int)uVar6 >> 6) * 8) &
                 (-2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4);
            piVar1 = (int *)(lVar19 + (ulong)uVar5 * 4);
            *piVar1 = *piVar1 + 1;
            uVar20 = (ulong)local_38;
            uVar8 = &local_b8;
            if (0x10 < uVar20) {
              uVar8 = local_b8.long_data;
            }
            uVar5 = 0xffffffff;
            if (uVar20 != 0) {
              lVar22 = 0;
LAB_0012a228:
              uVar24 = *(ulong *)uVar8;
              if (uVar24 == 0) goto code_r0x0012a230;
              iVar18 = 0;
              for (; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                iVar18 = iVar18 + 1;
              }
              uVar5 = iVar18 - (int)lVar22;
            }
LAB_0012a249:
          } while ((uVar5 != 0xffffffff) && (uVar5 <= uVar25 || directed));
        }
        if ((0x10 < local_38) &&
           ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
            (anon_union_128_2_84168a9f_for__data *)0x0)) {
          operator_delete__(local_b8.long_data);
        }
        uVar20 = (ulong)(uint)local_148._112_4_;
        pSVar7 = (SVOBitset *)local_158;
        if (0x10 < uVar20) {
          pSVar7 = (SVOBitset *)local_158._0_8_;
        }
        uVar5 = 0xffffffff;
        if (uVar20 != 0) {
          lVar19 = 0;
          do {
            BVar23 = (pSVar7->_data).short_data[0];
            if (BVar23 != 0) goto LAB_0012a2c1;
            lVar19 = lVar19 + -0x40;
            pSVar7 = (SVOBitset *)((long)&pSVar7->_data + 8);
          } while (uVar20 * 0x40 + lVar19 != 0);
        }
      }
      if ((0x10 < (uint)local_148._112_4_) && ((SVOBitset *)local_158._0_8_ != (SVOBitset *)0x0)) {
        operator_delete__((void *)local_158._0_8_);
      }
      uVar25 = uVar25 + 1;
      if (uVar25 == local_170) {
        uVar5 = (int)local_198 + 1;
        uVar25 = 2;
        if (2 < uVar5) {
          uVar25 = (ulong)uVar5;
        }
        uVar20 = 0;
        do {
          iVar18 = (int)uVar20;
          uVar24 = uVar20 & 0xffffffff;
          if (directed) {
            uVar24 = 0;
          }
          local_160 = local_148._120_8_;
          iVar11 = iVar18 + 0x3f;
          if (-1 < iVar18) {
            iVar11 = iVar18;
          }
          local_168 = (local_180->
                      super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                      )._M_impl.super__Vector_impl_data._M_start +
                      (local_190->max_graphs * iVar18 + *local_178);
          do {
            iVar21 = (int)uVar24;
            if (uVar20 == uVar24 && at_most) {
              pSVar13 = local_168;
              if (0x10 < local_168->n_words) {
                pSVar13 = (pointer)(local_168->_data).short_data[0];
              }
              iVar16 = iVar21 + 0x3f;
              if (-1 < iVar21) {
                iVar16 = iVar21;
              }
              (pSVar13->_data).short_data[iVar16 >> 6] =
                   (pSVar13->_data).short_data[iVar16 >> 6] | 1L << (uVar24 & 0x3f);
            }
            else if ((int)local_198 != 0) {
              uVar5 = *(uint *)(*(long *)(local_148._120_8_ + uVar24 * 0x18) + uVar20 * 4);
              pSVar13 = (local_180->
                        super__Vector_base<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              iVar16 = iVar21 + 0x3f;
              if (-1 < iVar21) {
                iVar16 = iVar21;
              }
              uVar14 = 1;
              uVar26 = local_190->max_graphs * iVar21 + *local_178;
              uVar6 = iVar18 * local_190->max_graphs + *local_178;
              do {
                if (uVar14 <= uVar5) {
                  if (pSVar13[uVar6].n_words < 0x11) {
                    pSVar17 = pSVar13 + uVar6;
                  }
                  else {
                    pSVar17 = (pointer)pSVar13[uVar6]._data.short_data[0];
                  }
                  (pSVar17->_data).short_data[iVar16 >> 6] =
                       (pSVar17->_data).short_data[iVar16 >> 6] | 1L << (uVar24 & 0x3f);
                  if (!directed) {
                    if (pSVar13[uVar26].n_words < 0x11) {
                      pSVar17 = pSVar13 + uVar26;
                    }
                    else {
                      pSVar17 = (pointer)pSVar13[uVar26]._data.short_data[0];
                    }
                    (pSVar17->_data).short_data[iVar11 >> 6] =
                         (pSVar17->_data).short_data[iVar11 >> 6] | 1L << (uVar20 & 0x3f);
                  }
                }
                uVar14 = uVar14 + 1;
                uVar26 = uVar26 + 1;
                uVar6 = uVar6 + 1;
              } while (uVar25 != uVar14);
            }
            uVar24 = (ulong)(iVar21 + 1U);
          } while (iVar21 + 1U < local_184);
          uVar20 = uVar20 + 1;
        } while (uVar20 != local_170);
        break;
      }
    } while( true );
  }
  if (pattern && (uint)local_198 != 0) {
    uVar5 = 1;
    do {
      uVar6 = 1;
      if (9 < uVar5) {
        uVar25 = (ulong)uVar5;
        uVar26 = 4;
        do {
          uVar6 = uVar26;
          uVar12 = (uint)uVar25;
          if (uVar12 < 100) {
            uVar6 = uVar6 - 2;
            goto LAB_0012a532;
          }
          if (uVar12 < 1000) {
            uVar6 = uVar6 - 1;
            goto LAB_0012a532;
          }
          if (uVar12 < 10000) goto LAB_0012a532;
          uVar25 = uVar25 / 10000;
          uVar26 = uVar6 + 4;
        } while (99999 < uVar12);
        uVar6 = uVar6 + 1;
      }
LAB_0012a532:
      _Var3._M_head_impl =
           (local_190->_imp)._M_t.
           super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           ._M_t.
           super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
           .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl;
      local_b8.short_data[0] =
           (BitWord)(anon_union_128_2_84168a9f_for__data *)(local_b8.short_data + 2);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 (ulong)uVar6,'\0');
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)local_b8.long_data,local_b8.short_data[1]._0_4_,uVar5);
      pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,0,0,"exact_path_",0xb);
      local_158._0_8_ = (pbVar9->_M_dataplus)._M_p;
      paVar15 = &pbVar9->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._0_8_ == paVar15) {
        local_148._0_8_ = paVar15->_M_allocated_capacity;
        local_148._8_8_ = *(undefined8 *)((long)&pbVar9->field_2 + 8);
        local_158._0_8_ = (SVOBitset *)local_148;
      }
      else {
        local_148._0_8_ = paVar15->_M_allocated_capacity;
      }
      local_158._8_8_ = pbVar9->_M_string_length;
      (pbVar9->_M_dataplus)._M_p = (pointer)paVar15;
      pbVar9->_M_string_length = 0;
      (pbVar9->field_2)._M_local_buf[0] = '\0';
      p_Var10 = (_List_node_base *)operator_new(0x30);
      p_Var10[1]._M_next = p_Var10 + 2;
      if ((SVOBitset *)local_158._0_8_ == (SVOBitset *)local_148) {
        p_Var10[2]._M_next = (_List_node_base *)local_148._0_8_;
        p_Var10[2]._M_prev = (_List_node_base *)local_148._8_8_;
      }
      else {
        p_Var10[1]._M_next = (_List_node_base *)local_158._0_8_;
        p_Var10[2]._M_next = (_List_node_base *)local_148._0_8_;
      }
      p_Var10[1]._M_prev = (_List_node_base *)local_158._8_8_;
      local_158._8_8_ = (pointer)0x0;
      local_148._0_8_ = local_148._0_8_ & 0xffffffffffffff00;
      local_158._0_8_ = (SVOBitset *)local_148;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar2 = (size_t *)((long)&(_Var3._M_head_impl)->supplemental_graph_names + 0x10);
      *psVar2 = *psVar2 + 1;
      if ((SVOBitset *)local_158._0_8_ != (SVOBitset *)local_148) {
        operator_delete((void *)local_158._0_8_,local_148._0_8_ + 1);
      }
      if ((anon_union_128_2_84168a9f_for__data *)local_b8.short_data[0] !=
          (anon_union_128_2_84168a9f_for__data *)(local_b8.short_data + 2)) {
        operator_delete(local_b8.long_data,local_b8.short_data[2] + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 <= (uint)local_198);
  }
  *local_178 = *local_178 + (int)local_198;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)(local_148 + 0x78));
  return;
code_r0x0012a180:
  lVar19 = lVar19 + -0x40;
  uVar8 = uVar8 + 8;
  if (uVar20 * 0x40 + lVar19 == 0) goto LAB_0012a199;
  goto LAB_0012a178;
code_r0x0012a230:
  lVar22 = lVar22 + -0x40;
  uVar8 = uVar8 + 8;
  if (uVar20 * 0x40 + lVar22 == 0) goto LAB_0012a249;
  goto LAB_0012a228;
LAB_0012a2c1:
  iVar18 = 0;
  for (; (BVar23 & 1) == 0; BVar23 = BVar23 >> 1 | 0x8000000000000000) {
    iVar18 = iVar18 + 1;
  }
  uVar5 = iVar18 - (int)lVar19;
  goto LAB_0012a0ba;
}

Assistant:

auto HomomorphismModel::_build_exact_path_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
    unsigned number_of_exact_path_graphs, bool directed, bool at_most, bool pattern) -> void
{
    vector<vector<unsigned>> path_counts(size, vector<unsigned>(size, 0));

    // count number of paths from w to v (unless directed, only w >= v, so not v to w)
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        if (at_most)
            nv.set(v);
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            if (at_most)
                nc.set(c);
            for (auto w = nc.find_first(); w != decltype(nc)::npos && (directed ? true : w <= v); w = nc.find_first()) {
                nc.reset(w);
                ++path_counts[v][w];
            }
        }
    }

    for (unsigned v = 0; v < size; ++v) {
        for (unsigned w = (directed ? 0 : v); w < size; ++w) {
            if (at_most && v == w)
                graph_rows[v * max_graphs + idx].set(w);
            else {
                // unless directed, w to v, not v to w, see above
                unsigned path_count = path_counts[w][v];
                for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p) {
                    if (path_count >= p) {
                        graph_rows[v * max_graphs + idx + p - 1].set(w);
                        if (! directed)
                            graph_rows[w * max_graphs + idx + p - 1].set(v);
                    }
                }
            }
        }
    }

    if (pattern)
        for (unsigned p = 1; p <= number_of_exact_path_graphs; ++p)
            _imp->supplemental_graph_names.push_back("exact_path_" + to_string(p));

    idx += number_of_exact_path_graphs;
}